

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int ncnn::deconvolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  pointer piVar7;
  uint uVar8;
  uint uVar9;
  int extraout_EAX;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  size_type __n;
  int iVar15;
  void *pvVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  uint uVar24;
  void *pvVar25;
  undefined4 uVar26;
  float fVar27;
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int size_1;
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_1c0;
  ulong local_1b0;
  void *local_1a8;
  allocator_type local_191;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  int local_164;
  ulong local_160;
  undefined1 local_158 [16];
  Mat *local_140;
  ulong local_138;
  ulong local_130;
  void *local_128;
  void *local_120;
  ulong local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  void *local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [16];
  long local_90;
  void *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  void *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_e8._8_8_ = local_e8._0_8_;
  local_e8._0_8_ = bottom_blob;
  uVar9 = bottom_blob->c;
  iVar30 = top_blob->w;
  local_180 = CONCAT44(local_180._4_4_,top_blob->c);
  uVar24 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar24;
  local_140 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_191);
  piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (0 < kernel_h) {
    iVar12 = 0;
    iVar15 = 0;
    iVar17 = 0;
    do {
      if (0 < kernel_w) {
        lVar18 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar12 + lVar18] = iVar15;
          iVar15 = iVar15 + dilation_w;
          lVar18 = lVar18 + 1;
        } while (kernel_w != (int)lVar18);
        iVar12 = iVar12 + (int)lVar18;
      }
      iVar15 = iVar15 + (iVar30 * dilation_h - dilation_w * kernel_w);
      iVar17 = iVar17 + 1;
    } while (iVar17 != kernel_h);
  }
  if ((int)local_180 == group && uVar9 == group) {
    uVar10 = (ulong)uVar9;
    if (0 < group) {
      local_110 = *(ulong *)(local_e8._0_8_ + 0x40) * *(ulong *)(local_e8._0_8_ + 0x10);
      local_118 = *(ulong *)local_e8._0_8_;
      pvVar25 = weight_data->data;
      iVar30 = top_blob->w;
      uVar14 = top_blob->elemsize;
      local_190 = top_blob->cstep * uVar14;
      uVar20 = (long)top_blob->h * (long)iVar30;
      pvVar16 = top_blob->data;
      local_128 = local_140->data;
      uVar10 = (uVar14 * uVar20 + 0xf & 0xfffffffffffffff0) / uVar14;
      if (top_blob->dims == 4) {
        uVar10 = uVar20;
      }
      uVar8 = (int)uVar10 * top_blob->d;
      uVar10 = CONCAT44(0,uVar8);
      local_178 = (ulong)(uint)(top_blob->h * iVar30);
      lVar18 = uVar10 - 1;
      uVar9 = *(uint *)(local_e8._0_8_ + 0x2c);
      uVar11 = *(ulong *)(local_e8._0_8_ + 0x30);
      local_180 = (ulong)stride_w;
      local_160 = (ulong)(uint)group;
      local_100 = CONCAT71(local_100._1_7_,
                           (long)local_140->c * local_140->cstep == 0 || local_128 == (void *)0x0);
      local_a8._0_8_ = uVar10;
      local_108 = (ulong)(uVar8 + 3 & 0xfffffffc);
      auVar33._8_4_ = (int)lVar18;
      auVar33._0_8_ = lVar18;
      auVar33._12_4_ = (int)((ulong)lVar18 >> 0x20);
      auVar33 = auVar33 ^ _DAT_005ec030;
      uVar20 = (long)pvVar16 + 0xc;
      local_1b0 = 0;
      auVar34 = _DAT_005ec010;
      auVar35 = _DAT_005ec020;
      auVar36 = _DAT_005ec030;
      local_120 = pvVar16;
      local_e8 = auVar33;
      do {
        uVar26 = 0;
        if ((char)local_100 == '\0') {
          uVar26 = *(undefined4 *)((long)local_128 + local_1b0 * 4);
        }
        if (0 < (int)local_a8._0_4_) {
          uVar10 = 0;
          do {
            auVar29._8_4_ = (int)uVar10;
            auVar29._0_8_ = uVar10;
            auVar29._12_4_ = (int)(uVar10 >> 0x20);
            auVar28 = (auVar29 | auVar35) ^ auVar36;
            iVar15 = auVar33._0_4_;
            bVar5 = iVar15 < auVar28._0_4_;
            iVar12 = auVar28._4_4_;
            iVar17 = auVar33._4_4_;
            if ((bool)(~(iVar17 < iVar12 || iVar12 == iVar17 && bVar5) & 1)) {
              *(undefined4 *)((uVar20 - 0xc) + uVar10 * 4) = uVar26;
            }
            if (iVar17 >= iVar12 && (iVar12 != iVar17 || !bVar5)) {
              *(undefined4 *)((uVar20 - 8) + uVar10 * 4) = uVar26;
            }
            auVar28 = (auVar29 | auVar34) ^ auVar36;
            iVar12 = auVar28._4_4_;
            if (iVar12 <= iVar17 && (iVar12 != iVar17 || auVar28._0_4_ <= iVar15)) {
              *(undefined4 *)((uVar20 - 4) + uVar10 * 4) = uVar26;
              *(undefined4 *)(uVar20 + uVar10 * 4) = uVar26;
            }
            uVar10 = uVar10 + 4;
          } while (local_108 != uVar10);
        }
        local_158._0_8_ = pvVar16;
        if (0 < (int)(uint)uVar11) {
          uVar10 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar19 = 0;
              do {
                if (0 < (int)uVar24) {
                  lVar18 = uVar19 * local_180 * 4 +
                           uVar10 * (long)stride_h * uVar14 * (long)iVar30 + local_190 * local_1b0;
                  fVar27 = *(float *)(local_110 * local_1b0 + local_118 +
                                      uVar10 * (long)(int)uVar9 * 4 + uVar19 * 4);
                  uVar21 = 0;
                  do {
                    lVar22 = (long)piVar7[uVar21];
                    *(float *)((long)local_120 + lVar22 * 4 + lVar18) =
                         *(float *)((long)pvVar25 + uVar21 * 4) * fVar27 +
                         *(float *)((long)local_120 + lVar22 * 4 + lVar18);
                    uVar21 = uVar21 + 1;
                  } while (uVar24 != uVar21);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar9);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != (uint)uVar11);
        }
        local_188 = uVar20;
        if (0 < (int)local_178) {
          pfVar2 = (float *)activation_params->data;
          uVar10 = 0;
          uVar19 = local_178;
          do {
            fVar27 = *(float *)((long)pvVar16 + uVar10 * 4);
            fVar32 = fVar27;
            switch(activation_type) {
            case 1:
              if (fVar27 <= 0.0) {
                fVar32 = 0.0;
              }
              break;
            case 2:
              fVar32 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar2 |
                              -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
              break;
            case 3:
              if (fVar27 <= *pfVar2) {
                fVar27 = *pfVar2;
              }
              fVar32 = pfVar2[1];
              if (fVar27 <= pfVar2[1]) {
                fVar32 = fVar27;
              }
              break;
            case 4:
              if (88.37626 <= fVar27) {
                fVar27 = 88.37626;
              }
              local_170 = uVar10;
              fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar27 < -88.37626) & ((uint)fVar27 ^ auVar36._0_4_)));
              pvVar16 = (void *)local_158._0_8_;
              uVar20 = local_188;
              uVar10 = local_170;
              uVar19 = local_178;
              auVar33 = local_e8;
              auVar34 = _DAT_005ec010;
              auVar35 = _DAT_005ec020;
              auVar36 = _DAT_005ec030;
              fVar32 = 1.0 / (fVar27 + 1.0);
              break;
            case 5:
              local_170 = uVar10;
              local_d8 = ZEXT416((uint)fVar27);
              fVar27 = expf(fVar27);
              fVar27 = logf(fVar27 + 1.0);
              fVar27 = tanhf(fVar27);
              pvVar16 = (void *)local_158._0_8_;
              uVar20 = local_188;
              uVar10 = local_170;
              uVar19 = local_178;
              auVar33 = local_e8;
              auVar34 = _DAT_005ec010;
              auVar35 = _DAT_005ec020;
              auVar36 = _DAT_005ec030;
              fVar32 = fVar27 * (float)local_d8._0_4_;
              break;
            case 6:
              fVar1 = *pfVar2;
              fVar31 = (float)((uint)pfVar2[1] ^ auVar36._0_4_) / fVar1;
              fVar32 = 0.0;
              if ((fVar31 <= fVar27) && (fVar32 = fVar27, fVar27 <= fVar31 + 1.0 / fVar1)) {
                fVar32 = (fVar1 * fVar27 + pfVar2[1]) * fVar27;
              }
            }
            *(float *)((long)pvVar16 + uVar10 * 4) = fVar32;
            uVar10 = uVar10 + 1;
          } while (uVar19 != uVar10);
        }
        local_1b0 = local_1b0 + 1;
        uVar20 = uVar20 + local_190;
        pvVar25 = (void *)((long)pvVar25 + __n * 4);
        pvVar16 = (void *)((long)pvVar16 + local_190);
        uVar10 = local_190;
      } while (local_1b0 != local_160);
    }
  }
  else {
    uVar9 = (int)uVar9 / group;
    uVar14 = (long)(int)local_180 / (long)group;
    local_164 = (int)uVar14;
    uVar10 = uVar14 & 0xffffffff;
    if (0 < group) {
      iVar30 = top_blob->w;
      local_f0 = top_blob->d;
      local_c0 = top_blob->data;
      local_70 = top_blob->elemsize;
      local_160 = top_blob->cstep * local_70;
      local_78 = (long)top_blob->h * (long)iVar30;
      local_80 = local_70 * local_78 + 0xf & 0xfffffffffffffff0;
      local_f4 = top_blob->dims;
      local_88 = weight_data->data;
      local_190 = (ulong)(uint)(top_blob->h * iVar30);
      local_170 = (ulong)stride_w;
      local_178 = (long)stride_h * (long)iVar30 * local_70;
      local_90 = (long)local_164;
      local_60 = (ulong)(uint)group;
      local_68 = local_160 * local_90;
      local_ec = uVar9 * local_164 * uVar24;
      local_128 = (void *)((long)(int)(uVar9 * uVar24) << 2);
      local_b0 = local_140->data;
      local_180 = (ulong)*(uint *)(local_e8._0_8_ + 0x2c);
      local_188 = (ulong)(uint)*(ulong *)(local_e8._0_8_ + 0x30);
      local_50 = uVar14 & 0xffffffff;
      local_b8 = (long)local_c0 + 0xc;
      local_130 = 0;
      local_138 = 0;
      auVar33 = _DAT_005ec010;
      auVar34 = _DAT_005ec020;
      auVar35 = _DAT_005ec030;
      local_58 = local_c0;
      do {
        if (0 < local_164) {
          local_1a8 = (void *)((long)local_88 + (long)(int)local_130 * 4);
          local_108 = local_138 * local_90;
          iVar30 = (int)local_78;
          if (local_f4 != 4) {
            iVar30 = (int)(local_80 / local_70);
          }
          local_118 = (ulong)(uint)(iVar30 * local_f0);
          iVar12 = (int)local_138;
          local_110 = CONCAT71(local_110._1_7_,
                               (long)local_140->c * local_140->cstep == 0 || local_b0 == (void *)0x0
                              );
          local_120 = (void *)(ulong)(iVar30 * local_f0 + 3U & 0xfffffffc);
          lVar18 = local_118 - 1;
          auVar36._8_4_ = (int)lVar18;
          auVar36._0_8_ = lVar18;
          auVar36._12_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar36 = auVar36 ^ auVar35;
          uVar14 = 0;
          pvVar25 = local_c0;
          lVar18 = local_b8;
          local_a8 = auVar36;
          do {
            uVar26 = 0;
            if ((char)local_110 == '\0') {
              uVar26 = *(undefined4 *)((long)local_b0 + (uVar14 + local_108) * 4);
            }
            if (0 < (int)local_118) {
              pvVar16 = (void *)0x0;
              do {
                auVar28._8_4_ = (int)pvVar16;
                auVar28._0_8_ = pvVar16;
                auVar28._12_4_ = (int)((ulong)pvVar16 >> 0x20);
                auVar29 = (auVar28 | auVar34) ^ auVar35;
                iVar15 = auVar36._0_4_;
                bVar5 = iVar15 < auVar29._0_4_;
                iVar30 = auVar29._4_4_;
                iVar17 = auVar36._4_4_;
                if ((bool)(~(iVar17 < iVar30 || iVar30 == iVar17 && bVar5) & 1)) {
                  *(undefined4 *)(lVar18 + -0xc + (long)pvVar16 * 4) = uVar26;
                }
                if (iVar17 >= iVar30 && (iVar30 != iVar17 || !bVar5)) {
                  *(undefined4 *)(lVar18 + -8 + (long)pvVar16 * 4) = uVar26;
                }
                auVar28 = (auVar28 | auVar33) ^ auVar35;
                iVar30 = auVar28._4_4_;
                if (iVar30 <= iVar17 && (iVar30 != iVar17 || auVar28._0_4_ <= iVar15)) {
                  *(undefined4 *)(lVar18 + -4 + (long)pvVar16 * 4) = uVar26;
                  *(undefined4 *)(lVar18 + (long)pvVar16 * 4) = uVar26;
                }
                pvVar16 = (void *)((long)pvVar16 + 4);
              } while (local_120 != pvVar16);
            }
            local_d8._0_8_ = pvVar25;
            if (0 < (int)local_188) {
              pvVar16 = (void *)((uVar14 + local_108) * local_160 + (long)local_58);
              local_158._0_8_ = pvVar16;
              local_1c0 = 0;
              do {
                if (0 < (int)local_180) {
                  iVar30 = *(int *)(local_e8._0_8_ + 0x2c);
                  lVar22 = *(long *)(local_e8._0_8_ + 0x10);
                  lVar3 = *(long *)(local_e8._0_8_ + 0x40);
                  lVar4 = *(long *)local_e8._0_8_;
                  uVar10 = 0;
                  do {
                    if (0 < (int)uVar9) {
                      lVar6 = uVar10 * local_170 * 4 + local_1c0 * local_178;
                      uVar20 = 0;
                      pvVar23 = local_1a8;
                      do {
                        if (0 < (int)uVar24) {
                          fVar27 = *(float *)((long)iVar30 * local_1c0 * lVar22 + lVar4 + uVar10 * 4
                                             + (uVar20 + uVar9 * iVar12) * lVar3 * lVar22);
                          uVar11 = 0;
                          do {
                            lVar13 = (long)piVar7[uVar11];
                            *(float *)((long)pvVar16 + lVar13 * 4 + lVar6) =
                                 *(float *)((long)pvVar23 + uVar11 * 4) * fVar27 +
                                 *(float *)((long)pvVar16 + lVar13 * 4 + lVar6);
                            uVar11 = uVar11 + 1;
                          } while (uVar24 != uVar11);
                        }
                        uVar20 = uVar20 + 1;
                        pvVar23 = (void *)((long)pvVar23 + __n * 4);
                      } while (uVar20 != uVar9);
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != local_180);
                }
                local_1c0 = local_1c0 + 1;
              } while (local_1c0 != local_188);
            }
            local_100 = uVar14;
            if (0 < (int)local_190) {
              pfVar2 = (float *)activation_params->data;
              uVar10 = 0;
              uVar14 = local_190;
              do {
                fVar27 = *(float *)((long)pvVar25 + uVar10 * 4);
                fVar32 = fVar27;
                switch(activation_type) {
                case 1:
                  if (fVar27 <= 0.0) {
                    fVar32 = 0.0;
                  }
                  break;
                case 2:
                  fVar32 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar2 |
                                  -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
                  break;
                case 3:
                  if (fVar27 <= *pfVar2) {
                    fVar27 = *pfVar2;
                  }
                  fVar32 = pfVar2[1];
                  if (fVar27 <= pfVar2[1]) {
                    fVar32 = fVar27;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar27) {
                    fVar27 = 88.37626;
                  }
                  fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar27 < -88.37626) & ((uint)fVar27 ^ auVar35._0_4_)
                                       ));
                  pvVar25 = (void *)local_d8._0_8_;
                  uVar14 = local_190;
                  auVar33 = _DAT_005ec010;
                  auVar34 = _DAT_005ec020;
                  auVar35 = _DAT_005ec030;
                  auVar36 = local_a8;
                  fVar32 = 1.0 / (fVar27 + 1.0);
                  break;
                case 5:
                  local_158 = ZEXT416((uint)fVar27);
                  fVar27 = expf(fVar27);
                  fVar27 = logf(fVar27 + 1.0);
                  fVar27 = tanhf(fVar27);
                  pvVar25 = (void *)local_d8._0_8_;
                  uVar14 = local_190;
                  auVar33 = _DAT_005ec010;
                  auVar34 = _DAT_005ec020;
                  auVar35 = _DAT_005ec030;
                  auVar36 = local_a8;
                  fVar32 = fVar27 * (float)local_158._0_4_;
                  break;
                case 6:
                  fVar1 = *pfVar2;
                  fVar31 = (float)((uint)pfVar2[1] ^ auVar35._0_4_) / fVar1;
                  fVar32 = 0.0;
                  if ((fVar31 <= fVar27) && (fVar32 = fVar27, fVar27 <= fVar31 + 1.0 / fVar1)) {
                    fVar32 = (fVar1 * fVar27 + pfVar2[1]) * fVar27;
                  }
                }
                *(float *)((long)pvVar25 + uVar10 * 4) = fVar32;
                uVar10 = uVar10 + 1;
              } while (uVar14 != uVar10);
            }
            uVar14 = local_100 + 1;
            lVar18 = lVar18 + local_160;
            local_1a8 = (void *)((long)local_1a8 + (long)local_128);
            pvVar25 = (void *)((long)pvVar25 + local_160);
          } while (uVar14 != local_50);
        }
        local_138 = local_138 + 1;
        local_b8 = local_b8 + local_68;
        local_130 = (ulong)(uint)((int)local_130 + local_ec);
        local_c0 = (void *)((long)local_c0 + local_68);
        uVar10 = local_68;
      } while (local_138 != local_60);
    }
  }
  iVar30 = (int)uVar10;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar30 = extraout_EAX;
  }
  return iVar30;
}

Assistant:

static int deconvolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat out = top_blob.channel(g);

            const float bias = bias_data.empty() ? 0.f : bias_data[g];

            out.fill(bias);

            // shadowed variable for less openmp task args
            const int w = bottom_blob.w;
            const int h = bottom_blob.h;
            const int outw = top_blob.w;
            const int outh = top_blob.h;

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = out.row(i * stride_h) + j * stride_w;

                    const float val = inptr[i * w + j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            {
                float* outptr = out;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                Mat out = top_blob.channel(g * outch_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                const float bias = bias_data.empty() ? 0.f : bias_data[g * outch_g + p];

                out.fill(bias);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const float val = bottom_blob.channel(inch_g * g + q).row(i)[j];

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}